

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditImageCompareTests.cpp
# Opt level: O2

void __thiscall dit::BilinearCompareCase::~BilinearCompareCase(BilinearCompareCase *this)

{
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BilinearCompareCase_0027eeb0;
  std::__cxx11::string::~string((string *)&this->m_cmpImg);
  std::__cxx11::string::~string((string *)&this->m_refImg);
  tcu::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

BilinearCompareCase (tcu::TestContext& testCtx, const char* name, const char* refImg, const char* cmpImg, const tcu::RGBA& threshold, bool expectedResult)
		: tcu::TestCase		(testCtx, name, "")
		, m_refImg			(refImg)
		, m_cmpImg			(cmpImg)
		, m_threshold		(threshold)
		, m_expectedResult	(expectedResult)
	{
	}